

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_PrintUnknownFieldsHidden_Test::
TextFormatTest_PrintUnknownFieldsHidden_Test(TextFormatTest_PrintUnknownFieldsHidden_Test *this)

{
  TextFormatTest_PrintUnknownFieldsHidden_Test *this_local;
  
  TextFormatTest::TextFormatTest(&this->super_TextFormatTest);
  (this->super_TextFormatTest).super_TextFormatTestBase.super_Test._vptr_Test =
       (_func_int **)&PTR__TextFormatTest_PrintUnknownFieldsHidden_Test_029ee698;
  return;
}

Assistant:

TEST_F(TextFormatTest, PrintUnknownFieldsHidden) {
  // Test printing of unknown fields in a message when suppressed.

  unittest::OneString message;
  message.set_data("data");
  UnknownFieldSet* unknown_fields = message.mutable_unknown_fields();

  unknown_fields->AddVarint(5, 1);
  unknown_fields->AddFixed32(5, 2);
  unknown_fields->AddFixed64(5, 3);
  unknown_fields->AddLengthDelimited(5, "4");
  unknown_fields->AddGroup(5)->AddVarint(10, 5);

  unknown_fields->AddVarint(8, 1);
  unknown_fields->AddVarint(8, 2);
  unknown_fields->AddVarint(8, 3);

  TextFormat::Printer printer;
  printer.SetHideUnknownFields(true);
  std::string output;
  printer.PrintToString(message, &output);

  EXPECT_EQ("data: \"data\"\n", output);
}